

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O0

void __thiscall cmdline::cmdline_error::cmdline_error(cmdline_error *this,string *msg)

{
  string *msg_local;
  cmdline_error *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__cmdline_error_00120a10;
  std::__cxx11::string::string((string *)&this->msg,(string *)msg);
  return;
}

Assistant:

cmdline_error(const std::string &msg) : msg(msg) {}